

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O2

void __thiscall tinyusdz::usdc::USDCReader::Impl::~Impl(Impl *this)

{
  CrateReader *this_00;
  
  this_00 = this->crate_reader;
  if (this_00 != (CrateReader *)0x0) {
    crate::CrateReader::~CrateReader(this_00);
  }
  operator_delete(this_00,0x270);
  this->crate_reader = (CrateReader *)0x0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->_supported_prim_attr_types)._M_t);
  ::std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&(this->_prim_table)._M_t);
  ::std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&(this->_variantPropChildren)._M_t);
  ::std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&(this->_variantPrimChildren)._M_t);
  ::std::
  _Rb_tree<int,_std::pair<const_int,_tinyusdz::Variant>,_std::_Select1st<std::pair<const_int,_tinyusdz::Variant>_>,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Variant>_>_>
  ::~_Rb_tree(&(this->_variants)._M_t);
  ::std::
  _Rb_tree<int,_std::pair<const_int,_std::pair<tinyusdz::Path,_tinyusdz::Property>_>,_std::_Select1st<std::pair<const_int,_std::pair<tinyusdz::Path,_tinyusdz::Property>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<tinyusdz::Path,_tinyusdz::Property>_>_>_>
  ::~_Rb_tree(&(this->_variantProps)._M_t);
  ::std::
  _Rb_tree<int,_std::pair<const_int,_tinyusdz::PrimSpec>,_std::_Select1st<std::pair<const_int,_tinyusdz::PrimSpec>_>,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::PrimSpec>_>_>
  ::~_Rb_tree(&(this->_variantPrimSpecs)._M_t);
  ::std::
  _Rb_tree<int,_std::pair<const_int,_tinyusdz::Prim>,_std::_Select1st<std::pair<const_int,_tinyusdz::Prim>_>,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>
  ::~_Rb_tree(&(this->_variantPrims)._M_t);
  ::std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>_>_>
  ::~_Rb_tree(&(this->_variantChildren)._M_t);
  ::std::
  _Rb_tree<tinyusdz::crate::Index,_std::pair<const_tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>_>,_std::_Select1st<std::pair<const_tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>_>_>,_std::less<tinyusdz::crate::Index>,_std::allocator<std::pair<const_tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>_>_>_>
  ::~_Rb_tree(&(this->_live_fieldsets)._M_t);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&this->_elemPaths);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&this->_paths);
  ::std::_Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>::
  ~_Vector_base(&(this->_string_indices).
                 super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>
               );
  ::std::_Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>::
  ~_Vector_base(&(this->_fieldset_indices).
                 super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>
               );
  ::std::_Vector_base<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>::
  ~_Vector_base(&(this->_fields).
                 super__Vector_base<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>
               );
  ::std::_Vector_base<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>::~_Vector_base
            (&(this->_specs).
              super__Vector_base<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>);
  ::std::
  vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>::
  ~vector(&this->_nodes);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

~Impl() {
    delete crate_reader;
    crate_reader = nullptr;
  }